

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_vif_linux.c
# Opt level: O1

void os_vif_linux_close(os_vif *vif)

{
  int __fd;
  os_fd *poVar1;
  
  if (((vif->_vif_node).list.next != (list_entity *)0x0) &&
     ((vif->_vif_node).list.prev != (list_entity *)0x0)) {
    poVar1 = vif->fd;
    __fd = poVar1->fd;
    if (__fd != -1) {
      close(__fd);
      poVar1->fd = -1;
    }
    avl_remove(&_vif_tree,&vif->_vif_node);
    return;
  }
  return;
}

Assistant:

void
os_vif_linux_close(struct os_vif *vif) {
  if (avl_is_node_added(&vif->_vif_node)) {
    os_fd_close(vif->fd);
    avl_remove(&_vif_tree, &vif->_vif_node);
  }
}